

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadString_Binary(COBImporter *this,string *out,StreamReaderLE *reader)

{
  bool bVar1;
  int8_t iVar2;
  reference pcVar3;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  StreamReaderLE *reader_local;
  string *out_local;
  COBImporter *this_local;
  
  StreamReader<false,_false>::GetI2(reader);
  std::__cxx11::string::resize((ulong)out);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    iVar2 = StreamReader<false,_false>::GetI1(reader);
    *pcVar3 = iVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void COBImporter::ReadString_Binary(std::string& out, StreamReaderLE& reader)
{
    out.resize( reader.GetI2());
    for(char& c : out) {
        c = reader.GetI1();
    }
}